

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::InitializeWAsmJsMemTag(ViewType type,WAsmJsMemTag *tag)

{
  code *pcVar1;
  bool bVar2;
  char16_t *pcVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000039;
  
  switch(CONCAT71(in_register_00000039,type) & 0xffffffff) {
  case 0:
    pcVar3 = L"HEAP8";
    goto LAB_00733af4;
  case 1:
    pcVar3 = L"HEAPU8";
    goto LAB_00733b7c;
  case 2:
    pcVar3 = L"HEAP16";
    goto LAB_00733af4;
  case 3:
    pcVar3 = L"HEAPU16";
    goto LAB_00733b7c;
  case 4:
    pcVar3 = L"HEAP32";
LAB_00733af4:
    tag->heapTag = pcVar3;
    tag->valueTag = L'I';
    return;
  case 5:
    pcVar3 = L"HEAPU32";
LAB_00733b7c:
    tag->heapTag = pcVar3;
    tag->valueTag = L'U';
    return;
  case 6:
    tag->heapTag = L"HEAPF32";
    tag->valueTag = L'F';
    return;
  case 7:
    tag->heapTag = L"HEAPF64";
    tag->valueTag = L'D';
    return;
  case 8:
    pcVar3 = L"HEAPI64";
    break;
  case 9:
    pcVar3 = L"HEAP8";
    break;
  case 10:
    pcVar3 = L"HEAPU8";
    break;
  case 0xb:
    pcVar3 = L"HEAP16";
    break;
  case 0xc:
    pcVar3 = L"HEAPU16";
    break;
  case 0xd:
    pcVar3 = L"HEAP32";
    break;
  case 0xe:
    pcVar3 = L"HEAPU32";
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x227,"((0))","(0)");
    if (bVar2) {
      *puVar4 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  tag->heapTag = pcVar3;
  tag->valueTag = L'L';
  return;
}

Assistant:

void AsmJsByteCodeDumper::InitializeWAsmJsMemTag(ArrayBufferView::ViewType type, _Out_ WAsmJsMemTag * tag)
    {
        switch (type)
        {
        case ArrayBufferView::TYPE_INT8:
            tag->heapTag = _u("HEAP8"); tag->valueTag = 'I';  break;
        case ArrayBufferView::TYPE_UINT8:
            tag->heapTag = _u("HEAPU8"); tag->valueTag = 'U'; break;
        case ArrayBufferView::TYPE_INT16:
            tag->heapTag = _u("HEAP16"); tag->valueTag = 'I'; break;
        case ArrayBufferView::TYPE_UINT16:
            tag->heapTag = _u("HEAPU16"); tag->valueTag = 'U'; break;
        case ArrayBufferView::TYPE_INT32:
            tag->heapTag = _u("HEAP32"); tag->valueTag = 'I'; break;
        case ArrayBufferView::TYPE_UINT32:
            tag->heapTag = _u("HEAPU32"); tag->valueTag = 'U'; break;
        case ArrayBufferView::TYPE_FLOAT32:
            tag->heapTag = _u("HEAPF32"); tag->valueTag = 'F'; break;
        case ArrayBufferView::TYPE_FLOAT64:
            tag->heapTag = _u("HEAPF64"); tag->valueTag = 'D'; break;
        case ArrayBufferView::TYPE_INT64:
            tag->heapTag = _u("HEAPI64"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_INT8_TO_INT64:
            tag->heapTag = _u("HEAP8"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_UINT8_TO_INT64:
            tag->heapTag = _u("HEAPU8"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_INT16_TO_INT64:
            tag->heapTag = _u("HEAP16"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_UINT16_TO_INT64:
            tag->heapTag = _u("HEAPU16"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_INT32_TO_INT64:
            tag->heapTag = _u("HEAP32"); tag->valueTag = 'L'; break;
        case ArrayBufferView::TYPE_UINT32_TO_INT64:
            tag->heapTag = _u("HEAPU32"); tag->valueTag = 'L'; break;
        default:
            Assume(UNREACHED);
        }
    }